

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_constructor_test.h
# Opt level: O1

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentFromInitializerList<phmap::node_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>_>
::TestBody(AssignmentFromInitializerList<phmap::node_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>_>
           *this)

{
  node_hash_set<phmap::priv::hash_internal::EnumClass,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  *s;
  char *message;
  Generator<phmap::priv::hash_internal::EnumClass,_void> gen;
  AssertionResult gtest_ar;
  TypeParam m;
  Generator<phmap::priv::hash_internal::EnumClass,_void> local_119;
  key_equal local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
  local_108;
  undefined4 local_f0;
  slot_type *local_e8;
  size_t sStack_e0;
  size_t local_d8;
  raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  local_d0;
  raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  local_88;
  allocator_type local_40;
  EnumClass local_38;
  EnumClass local_30;
  EnumClass local_28;
  EnumClass local_20;
  EnumClass local_18;
  
  local_38 = hash_internal::Generator<phmap::priv::hash_internal::EnumClass,_void>::operator()
                       (&local_119);
  local_30 = hash_internal::Generator<phmap::priv::hash_internal::EnumClass,_void>::operator()
                       (&local_119);
  local_28 = hash_internal::Generator<phmap::priv::hash_internal::EnumClass,_void>::operator()
                       (&local_119);
  local_20 = hash_internal::Generator<phmap::priv::hash_internal::EnumClass,_void>::operator()
                       (&local_119);
  local_18 = hash_internal::Generator<phmap::priv::hash_internal::EnumClass,_void>::operator()
                       (&local_119);
  local_88.size_ = 0;
  local_88.capacity_ = 0;
  local_88.ctrl_ = (ctrl_t *)0x0;
  local_88.slots_ = (slot_type *)0x0;
  local_108.
  super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
                 next_id<phmap::priv::StatefulTestingHash>()::gId.id_ + 1);
  local_118.super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (WithId<phmap::priv::StatefulTestingEqual>)
       (hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
        next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ + 1);
  local_88.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  .
  super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  .super__Tuple_impl<3UL,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>.
  super__Head_base<3UL,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>,_false>.
  _M_head_impl.id_ =
       (_Head_base<3UL,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>,_false>)
       (Alloc<phmap::priv::hash_internal::EnumClass>)0x0;
  local_88.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  .
  super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  .super__Head_base<2UL,_phmap::priv::StatefulTestingEqual,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (StatefulTestingEqual)
       (StatefulTestingEqual)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId.id_;
  local_88.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  .super__Head_base<1UL,_phmap::priv::StatefulTestingHash,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (StatefulTestingHash)
       (StatefulTestingHash)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId.id_;
  local_88.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId.id_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId.id_ + 2;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId.id_ + 2;
  local_40.id_ = 0;
  raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>
  ::raw_hash_set<phmap::priv::hash_internal::EnumClass_const*>
            ((raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>
              *)&local_d0,&local_38,(EnumClass *)&stack0xfffffffffffffff0,0,(hasher *)&local_108,
             &local_118,&local_40);
  raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  ::move_assign(&local_88,&local_d0);
  raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  ::destroy_slots(&local_d0);
  local_f0 = 3;
  std::
  vector<phmap::priv::hash_internal::EnumClass,std::allocator<phmap::priv::hash_internal::EnumClass>>
  ::vector<phmap::priv::hash_internal::EnumClass_const*,void>
            ((vector<phmap::priv::hash_internal::EnumClass,std::allocator<phmap::priv::hash_internal::EnumClass>>
              *)&local_e8,&local_38,(EnumClass *)&stack0xfffffffffffffff0,
             (allocator_type *)&local_108);
  local_d0.capacity_ = local_d8;
  local_d0.size_ = sStack_e0;
  local_d0.slots_ = local_e8;
  local_e8 = (slot_type *)0x0;
  sStack_e0 = 0;
  local_d8 = 0;
  local_d0.ctrl_._0_4_ = local_f0;
  keys<phmap::node_hash_set<phmap::priv::hash_internal::EnumClass,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>>
            (&local_108,(priv *)&local_88,s);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<phmap::priv::hash_internal::EnumClass>>
  ::operator()(&local_118,(char *)&local_d0,
               (vector<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
                *)"keys(m)");
  if (local_108.
      super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.
                    super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<phmap::priv::hash_internal::EnumClass,_std::allocator<phmap::priv::hash_internal::EnumClass>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.slots_ != (slot_type *)0x0) {
    operator_delete(local_d0.slots_,local_d0.capacity_ - (long)local_d0.slots_);
  }
  if (local_e8 != (slot_type *)0x0) {
    operator_delete(local_e8,local_d8 - (long)local_e8);
  }
  if ((char)local_118.super_WithId<phmap::priv::StatefulTestingEqual>.id_ == '\0') {
    testing::Message::Message((Message *)&local_d0);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0x1b7,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((long *)CONCAT44(local_d0.ctrl_._4_4_,local_d0.ctrl_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_d0.ctrl_._4_4_,local_d0.ctrl_._0_4_) + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  raw_hash_set<phmap::priv::NodeHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  ::destroy_slots(&local_88);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentFromInitializerList) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  TypeParam m;
  m = values;
  EXPECT_THAT(keys(m), ::testing::UnorderedElementsAreArray(values));
}